

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase493::run(TestCase493 *this)

{
  TupleElement<1U,_kj::Promise<kj::String>_> *__stat_loc;
  TupleElement<2U,_kj::Promise<int>_> *this_00;
  bool bVar1;
  __pid_t _Var2;
  TransformPromiseNodeBase *this_01;
  WaitScope waitScope;
  Array<char> local_c8;
  Own<kj::_::PromiseNode> local_b0;
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> promise;
  Tuple<Promise<int>,_Promise<String>,_Promise<int>_> split;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  this_01 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_01,&local_b0,
             _::
             TransformPromiseNode<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:497:65),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041b610;
  split.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<int,kj::String,kj::Promise<int>>,kj::_::Void,kj::(anonymous_namespace)::TestCase493::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (char *)&_::
                          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<int,kj::String,kj::Promise<int>>,kj::_::Void,kj::(anonymous_namespace)::TestCase493::run()::$_0,kj::_::PropagateException>>
                          ::instance;
  split.impl.super_TupleElement<0U,_kj::Promise<int>_>.value.super_PromiseBase.node.ptr =
       (PromiseNode *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<int,kj::String,kj::Promise<int>>,kj::_::Void,kj::(anonymous_namespace)::TestCase493::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c8.size_ = 0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)this_01;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_c8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&split);
  Own<kj::_::PromiseNode>::dispose(&local_b0);
  Promise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_>::split(&split,&promise);
  _Var2 = Promise<int>::wait((Promise<int> *)&split,&waitScope);
  if ((_Var2 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_c8.ptr = (char *)CONCAT44(local_c8.ptr._4_4_,0x7b);
    local_b0.disposer._0_4_ = Promise<int>::wait((Promise<int> *)&split,&waitScope);
    _::Debug::log<char_const(&)[58],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f7,ERROR,
               "\"failed: expected \" \"(123) == (get<0>(split).wait(waitScope))\", 123, get<0>(split).wait(waitScope)"
               ,(char (*) [58])"failed: expected (123) == (get<0>(split).wait(waitScope))",
               (int *)&local_c8,(int *)&local_b0);
  }
  __stat_loc = &split.impl.super_TupleElement<1U,_kj::Promise<kj::String>_>;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_c8,__stat_loc);
  bVar1 = kj::operator==("foo",(String *)&local_c8);
  Array<char>::~Array(&local_c8);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    Promise<kj::String>::wait((Promise<kj::String> *)&local_c8,__stat_loc);
    _::Debug::log<char_const(&)[60],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (get<1>(split).wait(waitScope))\", \"foo\", get<1>(split).wait(waitScope)"
               ,(char (*) [60])"failed: expected (\"foo\") == (get<1>(split).wait(waitScope))",
               (char (*) [4])0x357ec7,(String *)&local_c8);
    Array<char>::~Array(&local_c8);
  }
  this_00 = &split.impl.super_TupleElement<2U,_kj::Promise<int>_>;
  _Var2 = Promise<int>::wait(&this_00->value,&waitScope);
  if ((_Var2 != 0x141) && (_::Debug::minSeverity < 3)) {
    local_c8.ptr = (char *)CONCAT44(local_c8.ptr._4_4_,0x141);
    local_b0.disposer._0_4_ = Promise<int>::wait(&this_00->value,&waitScope);
    _::Debug::log<char_const(&)[58],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1f9,ERROR,
               "\"failed: expected \" \"(321) == (get<2>(split).wait(waitScope))\", 321, get<2>(split).wait(waitScope)"
               ,(char (*) [58])"failed: expected (321) == (get<2>(split).wait(waitScope))",
               (int *)&local_c8,(int *)&local_b0);
  }
  _::
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_>
  ::~TupleImpl(&split.impl);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Split) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Tuple<int, String, Promise<int>>> promise = evalLater([&]() {
    return kj::tuple(123, str("foo"), Promise<int>(321));
  });

  Tuple<Promise<int>, Promise<String>, Promise<int>> split = promise.split();

  EXPECT_EQ(123, get<0>(split).wait(waitScope));
  EXPECT_EQ("foo", get<1>(split).wait(waitScope));
  EXPECT_EQ(321, get<2>(split).wait(waitScope));
}